

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool gen_branch(DisasContext_conflict12 *ctx,arg_b *a,TCGCond cond)

{
  TCGContext_conflict11 *s;
  _Bool _Var1;
  TCGLabel *l_00;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 source2;
  TCGv_i64 source1;
  TCGLabel *l;
  TCGContext_conflict11 *tcg_ctx;
  TCGCond cond_local;
  arg_b *a_local;
  DisasContext_conflict12 *ctx_local;
  
  s = ctx->uc->tcg_ctx;
  l_00 = gen_new_label_riscv64(s);
  t = tcg_temp_new_i64(s);
  t_00 = tcg_temp_new_i64(s);
  gen_get_gpr(s,t,a->rs1);
  gen_get_gpr(s,t_00,a->rs2);
  tcg_gen_brcond_i64_riscv64(s,cond,t,t_00,l_00);
  gen_goto_tb(ctx,1,ctx->pc_succ_insn);
  gen_set_label(s,l_00);
  _Var1 = has_ext(ctx,4);
  if ((_Var1) || (((ctx->base).pc_next + (long)a->imm & 3) == 0)) {
    gen_goto_tb(ctx,0,(ctx->base).pc_next + (long)a->imm);
  }
  else {
    gen_exception_inst_addr_mis(ctx);
  }
  (ctx->base).is_jmp = DISAS_NORETURN;
  tcg_temp_free_i64(s,t);
  tcg_temp_free_i64(s,t_00);
  return true;
}

Assistant:

static void gen_branch(DisasContext *ctx, int insn_bytes)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    if (ctx->hflags & MIPS_HFLAG_BMASK) {
        int proc_hflags = ctx->hflags & MIPS_HFLAG_BMASK;
        /* Branches completion */
        clear_branch_hflags(ctx);
        ctx->base.is_jmp = DISAS_NORETURN;
        /* FIXME: Need to clear can_do_io.  */
        switch (proc_hflags & MIPS_HFLAG_BMASK_BASE) {
        case MIPS_HFLAG_FBNSLOT:
            gen_goto_tb(ctx, 0, ctx->base.pc_next + insn_bytes);
            break;
        case MIPS_HFLAG_B:
            /* unconditional branch */
            if (proc_hflags & MIPS_HFLAG_BX) {
                tcg_gen_xori_i32(tcg_ctx, tcg_ctx->hflags, tcg_ctx->hflags, MIPS_HFLAG_M16);
            }
            gen_goto_tb(ctx, 0, ctx->btarget);
            break;
        case MIPS_HFLAG_BL:
            /* blikely taken case */
            gen_goto_tb(ctx, 0, ctx->btarget);
            break;
        case MIPS_HFLAG_BC:
            /* Conditional branch */
            {
                TCGLabel *l1 = gen_new_label(tcg_ctx);

                tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_NE, tcg_ctx->bcond, 0, l1);
                gen_goto_tb(ctx, 1, ctx->base.pc_next + insn_bytes);
                gen_set_label(tcg_ctx, l1);
                gen_goto_tb(ctx, 0, ctx->btarget);
            }
            break;
        case MIPS_HFLAG_BR:
            /* unconditional branch to register */
            if (ctx->insn_flags & (ASE_MIPS16 | ASE_MICROMIPS)) {
                TCGv t0 = tcg_temp_new(tcg_ctx);
                TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);

                tcg_gen_andi_tl(tcg_ctx, t0, tcg_ctx->btarget, 0x1);
                tcg_gen_trunc_tl_i32(tcg_ctx, t1, t0);
                tcg_temp_free(tcg_ctx, t0);
                tcg_gen_andi_i32(tcg_ctx, tcg_ctx->hflags, tcg_ctx->hflags, ~(uint32_t)MIPS_HFLAG_M16);
                tcg_gen_shli_i32(tcg_ctx, t1, t1, MIPS_HFLAG_M16_SHIFT);
                tcg_gen_or_i32(tcg_ctx, tcg_ctx->hflags, tcg_ctx->hflags, t1);
                tcg_temp_free_i32(tcg_ctx, t1);

                tcg_gen_andi_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->btarget, ~(target_ulong)0x1);
            } else {
                tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_pc, tcg_ctx->btarget);
            }
            if (ctx->base.singlestep_enabled) {
                save_cpu_state(ctx, 0);
                gen_helper_raise_exception_debug(tcg_ctx, tcg_ctx->cpu_env);
            }
            tcg_gen_lookup_and_goto_ptr(tcg_ctx);
            break;
        default:
            fprintf(stderr, "unknown branch 0x%x\n", proc_hflags);
            abort();
        }
    }
}